

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O2

void __thiscall EmmyDebuggerManager::HandleBreak(EmmyDebuggerManager *this,lua_State *L)

{
  shared_ptr<Debugger> debugger;
  undefined1 local_48 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  GetDebugger((EmmyDebuggerManager *)local_48,(lua_State *)this);
  if ((Debugger *)local_48._0_8_ == (Debugger *)0x0) {
    AddDebugger((EmmyDebuggerManager *)(local_48 + 0x20),(lua_State *)this);
    std::__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2> *)local_48,
               (__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2> *)(local_48 + 0x20));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  }
  else {
    Debugger::SetCurrentState((Debugger *)local_48._0_8_,L);
  }
  std::__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2> *)(local_48 + 0x10),
             (__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2> *)local_48);
  SetHitDebugger(this,(shared_ptr<Debugger> *)(local_48 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 0x18));
  Debugger::HandleBreak((Debugger *)local_48._0_8_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  return;
}

Assistant:

void EmmyDebuggerManager::HandleBreak(lua_State* L)
{
	auto debugger = GetDebugger(L);

	if (debugger)
	{
		debugger->SetCurrentState(L);
	}
	else
	{
		debugger = AddDebugger(L);
	}

	SetHitDebugger(debugger);

	debugger->HandleBreak();
}